

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linktimeplugin.hpp
# Opt level: O1

void __thiscall linktimeplugin::RegistrarBase<Animal>::RegistrarBase(RegistrarBase<Animal> *this)

{
  iterator __position;
  vector<linktimeplugin::RegistrarBase<Animal>*,std::allocator<linktimeplugin::RegistrarBase<Animal>*>>
  *pvVar1;
  pointer __p;
  RegistrarBase<Animal> *local_10;
  
  this->_vptr_RegistrarBase = (_func_int **)&PTR__RegistrarBase_00103d90;
  if (registrars_ ==
      (vector<linktimeplugin::RegistrarBase<Animal>*,std::allocator<linktimeplugin::RegistrarBase<Animal>*>>
       *)0x0) {
    __p = (pointer)operator_new(0x18);
    (__p->
    super__Vector_base<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__p->
    super__Vector_base<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__p->
    super__Vector_base<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    __uniq_ptr_impl<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>,_std::default_delete<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>,_std::default_delete<std::vector<linktimeplugin::RegistrarBase<Animal>_*,_std::allocator<linktimeplugin::RegistrarBase<Animal>_*>_>_>_>
             *)&registrars_,__p);
  }
  pvVar1 = registrars_;
  __position._M_current = *(RegistrarBase<Animal> ***)(registrars_ + 8);
  if (__position._M_current == *(RegistrarBase<Animal> ***)(registrars_ + 0x10)) {
    local_10 = this;
    std::
    vector<linktimeplugin::RegistrarBase<Animal>*,std::allocator<linktimeplugin::RegistrarBase<Animal>*>>
    ::_M_realloc_insert<linktimeplugin::RegistrarBase<Animal>*>(registrars_,__position,&local_10);
  }
  else {
    *__position._M_current = this;
    *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
  }
  return;
}

Assistant:

RegistrarBase() noexcept {
            try {
                if (!registrars_) {
                    registrars_.reset(new std::vector<RegistrarBase<BASE>*>);
                }
                registrars_->push_back(this);
            } catch(...) {}
        }